

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O1

void __thiscall
Js::ScriptFunction::ExtractSnapObjectDataInto
          (ScriptFunction *this,SnapObject *objData,SlabAllocator *alloc)

{
  byte *pbVar1;
  
  if ((this->super_ScriptFunctionBase).super_JavascriptFunction.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    TTDAbort_unrecoverable_error("We are only doing this for functions with ParseableFunctionInfo.")
    ;
  }
  pbVar1 = TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<56ul>(alloc);
  (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x7b])(this,pbVar1,alloc);
  if (objData->SnapObjectTag == SnapScriptFunctionObject) {
    objData->AddtlSnapObjectInfo = pbVar1;
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void ScriptFunction::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTDAssert(this->GetFunctionInfo() != nullptr, "We are only doing this for functions with ParseableFunctionInfo.");

        TTD::NSSnapObjects::SnapScriptFunctionInfo* ssfi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapScriptFunctionInfo>();

        this->ExtractSnapObjectDataIntoSnapScriptFunctionInfo(ssfi, alloc);

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapScriptFunctionInfo*, TTD::NSSnapObjects::SnapObjectType::SnapScriptFunctionObject>(objData, ssfi);
    }